

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int gdImageColorClosestHWB(gdImagePtr im,int r,int g,int b)

{
  bool bVar1;
  float fVar2;
  float local_34;
  float dist;
  float mindist;
  int first;
  int ct;
  int i;
  int b_local;
  int g_local;
  int r_local;
  gdImagePtr im_local;
  
  mindist = -NAN;
  bVar1 = true;
  local_34 = 0.0;
  if (im->trueColor == 0) {
    for (first = 0; first < im->colorsTotal; first = first + 1) {
      if ((im->open[first] == 0) &&
         ((fVar2 = HWB_Diff(im->red[first],im->green[first],im->blue[first],r,g,b), bVar1 ||
          (fVar2 < local_34)))) {
        mindist = (float)first;
        bVar1 = false;
        local_34 = fVar2;
      }
    }
    im_local._4_4_ = mindist;
  }
  else {
    im_local._4_4_ = (float)(r * 0x10000 + g * 0x100 + b);
  }
  return (int)im_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageColorClosestHWB (gdImagePtr im, int r, int g, int b)
{
	int i;
	/* long rd, gd, bd; */
	int ct = (-1);
	int first = 1;
	float mindist = 0;
	if (im->trueColor) {
		return gdTrueColor (r, g, b);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		float dist;
		if (im->open[i]) {
			continue;
		}
		dist = HWB_Diff (im->red[i], im->green[i], im->blue[i], r, g, b);
		if (first || (dist < mindist)) {
			mindist = dist;
			ct = i;
			first = 0;
		}
	}
	return ct;
}